

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

If_Obj_t * If_ManCreateCi(If_Man_t *p)

{
  Vec_Ptr_t *p_00;
  If_Obj_t *Entry;
  
  Entry = If_ManSetupObj(p);
  *(uint *)Entry = *(uint *)Entry & 0xfffffff0 | 2;
  p_00 = p->vCis;
  Entry->IdPio = p_00->nSize;
  Vec_PtrPush(p_00,Entry);
  p->nObjs[2] = p->nObjs[2] + 1;
  return Entry;
}

Assistant:

If_Obj_t * If_ManCreateCi( If_Man_t * p )
{
    If_Obj_t * pObj;
    pObj = If_ManSetupObj( p );
    pObj->Type = IF_CI;
    pObj->IdPio = Vec_PtrSize( p->vCis );
    Vec_PtrPush( p->vCis, pObj );
    p->nObjs[IF_CI]++;
    return pObj;
}